

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O3

String * __thiscall stick::ArgumentParser::help(String *__return_storage_ptr__,ArgumentParser *this)

{
  Size SVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar4;
  ulong uVar5;
  Size SVar6;
  Argument *pAVar7;
  String local_108;
  String local_e8;
  char *local_c8;
  Size SStack_c0;
  Size local_b8;
  Allocator *local_b0;
  ArgumentParser *local_a0;
  char *local_98;
  Size SStack_90;
  Size local_88;
  DefaultAllocator *local_80;
  char *local_78;
  Size SStack_70;
  Size local_68;
  DefaultAllocator *local_60;
  size_t local_58;
  ulong local_50;
  char *local_48;
  long local_40;
  char *local_38;
  char *__dest;
  
  usage(__return_storage_ptr__,this);
  SVar6 = (this->m_info).m_length;
  if (SVar6 != 0) {
    local_c8 = (char *)0x0;
    local_b8 = 0;
    local_b0 = (this->m_info).m_allocator;
    SStack_c0 = SVar6;
    if ((this->m_info).m_cStr != (char *)0x0) {
      iVar3 = (*local_b0->_vptr_Allocator[2])(local_b0,SVar6 + 1,1);
      __dest = (char *)CONCAT44(extraout_var,iVar3);
      local_c8 = __dest;
      memset(__dest,0,SVar6 + 1);
      if (__dest == (char *)0x0) {
LAB_0010d57d:
        __assert_fail("m_cStr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                      ,0x1a0,"void stick::String::reserve(Size)");
      }
      local_b8 = SVar6;
      strcpy(__dest,(this->m_info).m_cStr);
    }
    String::append<char_const*,stick::String,char_const*>(__return_storage_ptr__,"\n",&local_c8);
    if (local_c8 != (char *)0x0) {
      local_40 = local_b8 + 1;
      local_48 = local_c8;
      (*local_b0->_vptr_Allocator[3])();
      local_c8 = (char *)0x0;
      SStack_c0 = 0;
      local_b8 = 0;
    }
  }
  if ((this->m_args).m_count != 0) {
    if (this->m_requiredCount != 0) {
      String::append(__return_storage_ptr__,"\nRequired arguments:\n");
      SVar6 = (this->m_args).m_count;
      local_a0 = this;
      if (SVar6 != 0) {
        pAVar7 = (Argument *)(this->m_args).m_data.ptr;
        lVar4 = SVar6 * 0x90;
        do {
          if (pAVar7->bOptional == false) {
            SVar6 = (pAVar7->shortName).m_length;
            if (SVar6 != 0) {
              SVar1 = __return_storage_ptr__->m_length;
              uVar5 = SVar6 + SVar1;
              if ((__return_storage_ptr__->m_capacity < uVar5) &&
                 (uVar2 = uVar5 * 2, __return_storage_ptr__->m_capacity < uVar2)) {
                local_38 = __return_storage_ptr__->m_cStr;
                local_58 = uVar2 | 1;
                local_50 = uVar2;
                iVar3 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                  (__return_storage_ptr__->m_allocator,local_58,1);
                __return_storage_ptr__->m_cStr = (char *)CONCAT44(extraout_var_00,iVar3);
                memset((char *)CONCAT44(extraout_var_00,iVar3),0,local_58);
                if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d57d;
                if (local_38 != (char *)0x0) {
                  strcpy(__return_storage_ptr__->m_cStr,local_38);
                  local_40 = __return_storage_ptr__->m_capacity + 1;
                  local_48 = local_38;
                  (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                            (__return_storage_ptr__->m_allocator,&local_48);
                }
                __return_storage_ptr__->m_capacity = local_50;
              }
              __return_storage_ptr__->m_length = uVar5;
              strcpy(__return_storage_ptr__->m_cStr + SVar1,(pAVar7->shortName).m_cStr);
            }
            SVar6 = (pAVar7->name).m_length;
            if (SVar6 != 0) {
              if ((pAVar7->shortName).m_length != 0) {
                String::append(__return_storage_ptr__,", ");
                SVar6 = (pAVar7->name).m_length;
                if (SVar6 == 0) goto LAB_0010d09c;
              }
              SVar1 = __return_storage_ptr__->m_length;
              uVar5 = SVar6 + SVar1;
              if ((__return_storage_ptr__->m_capacity < uVar5) &&
                 (uVar2 = uVar5 * 2, __return_storage_ptr__->m_capacity < uVar2)) {
                local_38 = __return_storage_ptr__->m_cStr;
                local_58 = uVar2 | 1;
                local_50 = uVar2;
                iVar3 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                  (__return_storage_ptr__->m_allocator,local_58,1);
                __return_storage_ptr__->m_cStr = (char *)CONCAT44(extraout_var_01,iVar3);
                memset((char *)CONCAT44(extraout_var_01,iVar3),0,local_58);
                if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d57d;
                if (local_38 != (char *)0x0) {
                  strcpy(__return_storage_ptr__->m_cStr,local_38);
                  local_40 = __return_storage_ptr__->m_capacity + 1;
                  local_48 = local_38;
                  (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                            (__return_storage_ptr__->m_allocator,&local_48);
                }
                __return_storage_ptr__->m_capacity = local_50;
              }
              __return_storage_ptr__->m_length = uVar5;
              strcpy(__return_storage_ptr__->m_cStr + SVar1,(pAVar7->name).m_cStr);
            }
LAB_0010d09c:
            detail::argumentSignature(&local_108,pAVar7);
            SVar6 = (pAVar7->info).m_length;
            if (SVar6 == 0) {
              if (defaultAllocator()::m_def == '\0') {
                help();
              }
              local_98 = (char *)0x0;
              SStack_90 = 0;
              local_88 = 0;
              local_80 = defaultAllocator::m_def;
            }
            else {
              local_98 = (char *)0x0;
              local_88 = 0;
              local_80 = (DefaultAllocator *)(pAVar7->info).m_allocator;
              SStack_90 = SVar6;
              if ((pAVar7->info).m_cStr != (char *)0x0) {
                iVar3 = (*(local_80->super_Allocator)._vptr_Allocator[2])(local_80,SVar6 + 1,1);
                local_98 = (char *)CONCAT44(extraout_var_02,iVar3);
                memset(local_98,0,SVar6 + 1);
                if (local_98 == (char *)0x0) goto LAB_0010d57d;
                local_88 = SVar6;
                strcpy(local_98,(pAVar7->info).m_cStr);
              }
            }
            String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                      (__return_storage_ptr__," ",&local_108,"    ",&local_98,"\n");
            if (local_98 != (char *)0x0) {
              local_40 = local_88 + 1;
              local_48 = local_98;
              (*(local_80->super_Allocator)._vptr_Allocator[3])(local_80,&local_48);
              local_98 = (char *)0x0;
              SStack_90 = 0;
              local_88 = 0;
            }
            if (local_108.m_cStr != (char *)0x0) {
              local_40 = local_108.m_capacity + 1;
              local_48 = local_108.m_cStr;
              (*(local_108.m_allocator)->_vptr_Allocator[3])(local_108.m_allocator,&local_48);
              local_108.m_cStr = (char *)0x0;
              local_108.m_length = 0;
              local_108.m_capacity = 0;
            }
          }
          pAVar7 = pAVar7 + 1;
          lVar4 = lVar4 + -0x90;
        } while (lVar4 != 0);
      }
      String::append(__return_storage_ptr__,"\n");
      this = local_a0;
      if ((local_a0->m_args).m_count <= local_a0->m_requiredCount) {
        return __return_storage_ptr__;
      }
    }
    String::append(__return_storage_ptr__,"Optional arguments:\n");
    SVar6 = (this->m_args).m_count;
    if (SVar6 != 0) {
      pAVar7 = (Argument *)(this->m_args).m_data.ptr;
      lVar4 = SVar6 * 0x90;
      do {
        if (pAVar7->bOptional == true) {
          SVar6 = (pAVar7->shortName).m_length;
          if (SVar6 != 0) {
            SVar1 = __return_storage_ptr__->m_length;
            uVar5 = SVar6 + SVar1;
            if ((__return_storage_ptr__->m_capacity < uVar5) &&
               (uVar2 = uVar5 * 2, __return_storage_ptr__->m_capacity < uVar2)) {
              local_38 = __return_storage_ptr__->m_cStr;
              local_58 = uVar2 | 1;
              local_50 = uVar2;
              iVar3 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                (__return_storage_ptr__->m_allocator,local_58,1);
              __return_storage_ptr__->m_cStr = (char *)CONCAT44(extraout_var_03,iVar3);
              memset((char *)CONCAT44(extraout_var_03,iVar3),0,local_58);
              if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d57d;
              if (local_38 != (char *)0x0) {
                strcpy(__return_storage_ptr__->m_cStr,local_38);
                local_40 = __return_storage_ptr__->m_capacity + 1;
                local_48 = local_38;
                (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                          (__return_storage_ptr__->m_allocator,&local_48);
              }
              __return_storage_ptr__->m_capacity = local_50;
            }
            __return_storage_ptr__->m_length = uVar5;
            strcpy(__return_storage_ptr__->m_cStr + SVar1,(pAVar7->shortName).m_cStr);
          }
          SVar6 = (pAVar7->name).m_length;
          if (SVar6 != 0) {
            if ((pAVar7->shortName).m_length != 0) {
              String::append(__return_storage_ptr__,", ");
              SVar6 = (pAVar7->name).m_length;
              if (SVar6 == 0) goto LAB_0010d406;
            }
            SVar1 = __return_storage_ptr__->m_length;
            uVar5 = SVar6 + SVar1;
            if ((__return_storage_ptr__->m_capacity < uVar5) &&
               (uVar2 = uVar5 * 2, __return_storage_ptr__->m_capacity < uVar2)) {
              local_38 = __return_storage_ptr__->m_cStr;
              local_58 = uVar2 | 1;
              local_50 = uVar2;
              iVar3 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                (__return_storage_ptr__->m_allocator,local_58,1);
              __return_storage_ptr__->m_cStr = (char *)CONCAT44(extraout_var_04,iVar3);
              memset((char *)CONCAT44(extraout_var_04,iVar3),0,local_58);
              if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d57d;
              if (local_38 != (char *)0x0) {
                strcpy(__return_storage_ptr__->m_cStr,local_38);
                local_40 = __return_storage_ptr__->m_capacity + 1;
                local_48 = local_38;
                (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                          (__return_storage_ptr__->m_allocator,&local_48);
              }
              __return_storage_ptr__->m_capacity = local_50;
            }
            __return_storage_ptr__->m_length = uVar5;
            strcpy(__return_storage_ptr__->m_cStr + SVar1,(pAVar7->name).m_cStr);
          }
LAB_0010d406:
          detail::argumentSignature(&local_e8,pAVar7);
          SVar6 = (pAVar7->info).m_length;
          if (SVar6 == 0) {
            if (defaultAllocator()::m_def == '\0') {
              help();
            }
            local_78 = (char *)0x0;
            SStack_70 = 0;
            local_68 = 0;
            local_60 = defaultAllocator::m_def;
          }
          else {
            local_78 = (char *)0x0;
            local_68 = 0;
            local_60 = (DefaultAllocator *)(pAVar7->info).m_allocator;
            SStack_70 = SVar6;
            if ((pAVar7->info).m_cStr != (char *)0x0) {
              iVar3 = (*(local_60->super_Allocator)._vptr_Allocator[2])(local_60,SVar6 + 1,1);
              local_78 = (char *)CONCAT44(extraout_var_05,iVar3);
              memset(local_78,0,SVar6 + 1);
              if (local_78 == (char *)0x0) goto LAB_0010d57d;
              local_68 = SVar6;
              strcpy(local_78,(pAVar7->info).m_cStr);
            }
          }
          String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                    (__return_storage_ptr__," ",&local_e8,"    ",&local_78,"\n");
          if (local_78 != (char *)0x0) {
            local_40 = local_68 + 1;
            local_48 = local_78;
            (*(local_60->super_Allocator)._vptr_Allocator[3])(local_60,&local_48);
            local_78 = (char *)0x0;
            SStack_70 = 0;
            local_68 = 0;
          }
          if (local_e8.m_cStr != (char *)0x0) {
            local_40 = local_e8.m_capacity + 1;
            local_48 = local_e8.m_cStr;
            (*(local_e8.m_allocator)->_vptr_Allocator[3])(local_e8.m_allocator,&local_48);
            local_e8.m_cStr = (char *)0x0;
            local_e8.m_length = 0;
            local_e8.m_capacity = 0;
          }
        }
        pAVar7 = pAVar7 + 1;
        lVar4 = lVar4 + -0x90;
      } while (lVar4 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String ArgumentParser::help() const
{
    String ret = usage();

    if (m_info.length())
        ret.append(AppendVariadicFlag(), "\n", m_info, "\n");

    if (m_args.count())
    {
        if (m_requiredCount)
        {
            ret.append("\nRequired arguments:\n");
            for (auto & arg : m_args)
            {
                if (!arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
            ret.append("\n");
        }
        if (m_args.count() > m_requiredCount)
        {
            ret.append("Optional arguments:\n");
            for (auto & arg : m_args)
            {
                if (arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
        }
    }

    return ret;
}